

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

size_t drwav__on_read(drwav_read_proc onRead,void *pUserData,void *pBufferOut,size_t bytesToRead,
                     drwav_uint64 *pCursor)

{
  size_t sVar1;
  
  if (onRead == (drwav_read_proc)0x0) {
    __assert_fail("onRead != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                  ,0x602,
                  "size_t drwav__on_read(drwav_read_proc, void *, void *, size_t, drwav_uint64 *)");
  }
  if (pCursor != (drwav_uint64 *)0x0) {
    sVar1 = (*onRead)(pUserData,pBufferOut,bytesToRead);
    *pCursor = *pCursor + sVar1;
    return sVar1;
  }
  __assert_fail("pCursor != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                ,0x603,
                "size_t drwav__on_read(drwav_read_proc, void *, void *, size_t, drwav_uint64 *)");
}

Assistant:

size_t drwav__on_read(drwav_read_proc onRead, void* pUserData, void* pBufferOut, size_t bytesToRead, drwav_uint64* pCursor)
{
    drwav_assert(onRead != NULL);
    drwav_assert(pCursor != NULL);

    size_t bytesRead = onRead(pUserData, pBufferOut, bytesToRead);
    *pCursor += bytesRead;
    return bytesRead;
}